

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O2

int __thiscall
CVmObjFileName::equals(CVmObjFileName *this,vm_obj_id_t self,vm_val_t *val,int param_3)

{
  void *pvVar1;
  int iVar2;
  ushort *puVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  char *b;
  long *plVar6;
  uint uVar7;
  err_frame_t err_cur__;
  uint local_f8 [2];
  undefined8 local_f0;
  void *local_e8;
  __jmp_buf_tag local_e0;
  
  if ((val->typ == VM_OBJ) &&
     (uVar7 = (val->val).obj & 0xfff,
     iVar2 = (**(code **)(*(long *)&G_obj_table_X.pages_[(val->val).obj >> 0xc][uVar7].ptr_ + 8))
                       (G_obj_table_X.pages_[(val->val).obj >> 0xc] + uVar7,metaclass_reg_),
     iVar2 != 0)) {
    if (G_obj_table_X.pages_[(val->val).obj >> 0xc] != (CVmObjPageEntry *)0x0) {
      iVar2 = fn_file_names_equal((this->super_CVmObject).ext_ + 8,
                                  (char *)(*(long *)((long)&G_obj_table_X.pages_
                                                            [(val->val).obj >> 0xc]
                                                            [(val->val).obj & 0xfff].ptr_ + 8) + 8))
      ;
      return iVar2;
    }
  }
  puVar3 = (ushort *)vm_val_t::get_as_string(val);
  if (puVar3 == (ushort *)0x0) {
    iVar2 = 0;
  }
  else {
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    local_f0 = *puVar4;
    uVar5 = _ZTW11G_err_frame();
    *(uint **)uVar5 = local_f8;
    local_f8[0] = _setjmp(&local_e0);
    if (local_f8[0] == 0) {
      b = lib_copy_str((char *)(puVar3 + 1),(ulong)*puVar3);
      uVar7 = fn_file_names_equal((this->super_CVmObject).ext_ + 8,b);
      this = (CVmObjFileName *)(ulong)uVar7;
    }
    else {
      b = (char *)0x0;
    }
    if (-1 < (short)local_f8[0]) {
      local_f8[0] = local_f8[0] | 0x8000;
      lib_free_str(b);
    }
    uVar5 = local_f0;
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    *puVar4 = uVar5;
    if ((local_f8[0] & 0x4001) != 0) {
      puVar4 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(byte *)*puVar4 & 2) != 0) {
        plVar6 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar6 + 0x10));
      }
      pvVar1 = local_e8;
      plVar6 = (long *)_ZTW11G_err_frame();
      *(void **)(*plVar6 + 0x10) = pvVar1;
      err_rethrow();
    }
    if ((local_f8[0] & 2) != 0) {
      free(local_e8);
    }
    iVar2 = (int)this;
  }
  return iVar2;
}

Assistant:

int CVmObjFileName::equals(VMG_ vm_obj_id_t self, const vm_val_t *val,
                           int /*depth*/) const
{
    /* check the type of the other value */
    CVmObjFileName *fn;
    const char *str;
    if ((fn = vm_val_cast(CVmObjFileName, val)) != 0)
    {
        /* it's another FileName object - compare its path */
        return fn_file_names_equal(
            vmg_ get_ext()->get_str(), fn->get_ext()->get_str());
    }
    else if ((str = val->get_as_string(vmg0_)) != 0)
    {
        char *strz = 0;
        int eq;
        err_try
        {
            /* make a null-terminated copy of the other name */
            strz = lib_copy_str(str + VMB_LEN, vmb_get_len(str));
            
            /* compare the names */
            eq = fn_file_names_equal(vmg_ get_ext()->get_str(), strz);
        }
        err_finally
        {
            lib_free_str(strz);
        }